

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

void init_inter_mode_params
               (MV *src_mv,InterPredParams *inter_pred_params,SubpelParams *subpel_params,
               scale_factors *sf,int width,int height)

{
  undefined8 in_RCX;
  long in_RSI;
  
  *(undefined8 *)(in_RSI + 0xa8) = in_RCX;
  init_subpel_params(src_mv,inter_pred_params,subpel_params,sf._4_4_,(int)sf);
  return;
}

Assistant:

static inline void init_inter_mode_params(
    const MV *const src_mv, InterPredParams *const inter_pred_params,
    SubpelParams *subpel_params, const struct scale_factors *sf, int width,
    int height) {
  inter_pred_params->scale_factors = sf;
  init_subpel_params(src_mv, inter_pred_params, subpel_params, width, height);
}